

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

void __thiscall
CCheckQueue<CScriptCheck>::Add
          (CCheckQueue<CScriptCheck> *this,
          vector<CScriptCheck,_std::allocator<CScriptCheck>_> *vChecks)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_28._M_owns = false;
    local_28._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_28);
    std::vector<CScriptCheck,std::allocator<CScriptCheck>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<CScriptCheck*,std::vector<CScriptCheck,std::allocator<CScriptCheck>>>>>
              ((vector<CScriptCheck,std::allocator<CScriptCheck>> *)&this->queue,
               (this->queue).super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>._M_impl
               .super__Vector_impl_data._M_finish,
               (vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    this->nTodo = this->nTodo +
                  (int)((ulong)((long)(vChecks->
                                      super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(vChecks->
                                     super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333
    ;
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    if ((long)(vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(vChecks->super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>)._M_impl.
              super__Vector_impl_data._M_start == 0x50) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }